

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

void __thiscall
iDynTree::XMLParser::setDocumentFactory
          (XMLParser *this,
          function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *factory)

{
  bool bVar1;
  function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *in_RSI;
  function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>
  *in_stack_ffffffffffffffe8;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>
                      *)0x128d2f);
  if (bVar1) {
    std::
    unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                  *)0x128d3f);
    std::function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>::operator=
              (in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    std::
    unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                  *)0x128d5f);
    std::function<std::shared_ptr<iDynTree::XMLDocument>(iDynTree::XMLParserState&)>::operator=
              (in_RSI,(anon_class_1_0_00000001 *)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void XMLParser::setDocumentFactory(std::function<std::shared_ptr<XMLDocument>(XMLParserState& state)> factory)
    {
        assert(m_pimpl);
        if (factory) {
            m_pimpl->f_documentFactory = factory;
        } else {
            // Restore the default function
            m_pimpl->f_documentFactory = [](XMLParserState& state){ return std::shared_ptr<XMLDocument>(new XMLDocument(state)); };
        }
    }